

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdcmpgif.c
# Opt level: O2

int main(int argc,char **argv)

{
  FILE *pFVar1;
  gdImagePtr im1;
  gdImagePtr im2;
  char *__ptr;
  size_t sStack_20;
  
  if (argc == 3) {
    pFVar1 = fopen(argv[1],"rb");
    if (pFVar1 == (FILE *)0x0) {
      __ptr = "Input file does not exist!\n";
      sStack_20 = 0x1b;
    }
    else {
      im1 = (gdImagePtr)gdImageCreateFromGif(pFVar1);
      fclose(pFVar1);
      if (im1 == (gdImagePtr)0x0) {
        __ptr = "Input is not in GIF format!\n";
        sStack_20 = 0x1c;
      }
      else {
        pFVar1 = fopen(argv[2],"rb");
        if (pFVar1 == (FILE *)0x0) {
          __ptr = "Input file 2 does not exist!\n";
          sStack_20 = 0x1d;
        }
        else {
          im2 = (gdImagePtr)gdImageCreateFromGif(pFVar1);
          fclose(pFVar1);
          if (im2 != (gdImagePtr)0x0) {
            CompareImages("gdcmpgif",im1,im2);
            gdImageDestroy(im1);
            gdImageDestroy(im2);
            return 0;
          }
          __ptr = "Input 2 is not in GIF format!\n";
          sStack_20 = 0x1e;
        }
      }
    }
  }
  else {
    __ptr = "Usage: gdcmpgif filename.gif filename.gif\n";
    sStack_20 = 0x2a;
  }
  fwrite(__ptr,sStack_20,1,_stderr);
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{
	gdImagePtr im1, im2;
	FILE *in;

	if (argc != 3) {
		fprintf(stderr, "Usage: gdcmpgif filename.gif filename.gif\n");
		exit(1);
	}
	in = fopen(argv[1], "rb");
	if (!in) {
		fprintf(stderr, "Input file does not exist!\n");
		exit(1);
	}
	im1 = gdImageCreateFromGif(in);
	fclose(in);

	if (!im1) {
		fprintf(stderr, "Input is not in GIF format!\n");
		exit(1);
	}

	in = fopen(argv[2], "rb");
	if (!in) {
		fprintf(stderr, "Input file 2 does not exist!\n");
		exit(1);
	}
	im2 = gdImageCreateFromGif(in);
	fclose(in);

	if (!im2) {
		fprintf(stderr, "Input 2 is not in GIF format!\n");
		exit(1);
	}

	CompareImages("gdcmpgif", im1, im2);

	gdImageDestroy(im1);
	gdImageDestroy(im2);

	return 0;
}